

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O0

_Bool rect_2D_contains_point(rect_2D rect,vec2 pt)

{
  vec2 vVar1;
  undefined1 local_31;
  undefined4 local_30;
  undefined4 uStack_2c;
  vec2 p1;
  vec2 p0;
  vec2 pt_local;
  rect_2D rect_local;
  
  p1.x = rect.top_left.x;
  p1.y = rect.top_left.y;
  rect_local.top_left.x = rect.size.x;
  rect_local.top_left.y = rect.size.y;
  vVar1 = vec2_create(p1.x + rect_local.top_left.x,p1.y - rect_local.top_left.y);
  p0.x = pt.x;
  local_31 = false;
  if (((p1.x <= p0.x) && (local_30 = vVar1.x, local_31 = false, p0.x <= local_30)) &&
     (p0.y = pt.y, local_31 = false, p0.y <= p1.y)) {
    uStack_2c = vVar1.y;
    local_31 = uStack_2c <= p0.y;
  }
  return local_31;
}

Assistant:

bool rect_2D_contains_point(struct rect_2D rect, vec2 pt) {
    vec2 p0 = rect.top_left;
    vec2 p1 = V2(p0.x + rect.size.x, p0.y - rect.size.y);
    return pt.x >= p0.x && pt.x <= p1.x &&
        pt.y <= p0.y && pt.y >= p1.y;
}